

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O0

void __thiscall HttpHeaderBase::buildHeader(HttpHeaderBase *this)

{
  int iVar1;
  char *pcVar2;
  int local_14;
  int i;
  HttpHeaderBase *this_local;
  
  iVar1 = (*this->_vptr_HttpHeaderBase[4])();
  if (iVar1 < 1) {
    std::__cxx11::string::clear();
  }
  else {
    for (local_14 = 0; local_14 < this->mNumFields; local_14 = local_14 + 1) {
      pcVar2 = getFieldTypeString(this,this->mFields[local_14].mType);
      std::__cxx11::string::operator+=((string *)&this->mHeaderStr,pcVar2);
      std::__cxx11::string::operator+=((string *)&this->mHeaderStr,": ");
      std::__cxx11::string::operator+=((string *)&this->mHeaderStr,this->mFields[local_14].mData);
      std::__cxx11::string::operator+=((string *)&this->mHeaderStr,"\r\n");
    }
    std::__cxx11::string::operator+=((string *)&this->mHeaderStr,"\r\n");
  }
  return;
}

Assistant:

void HttpHeaderBase::buildHeader() const
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	if (buildFirstLine() <= 0)
	{
		mHeaderStr.clear();
		return;
	}
	
	for (int i = 0; i < mNumFields; i++)
	{
		mHeaderStr += getFieldTypeString(mFields[i].mType);
		mHeaderStr += ": ";
		mHeaderStr += mFields[i].mData;
		mHeaderStr += "\r\n";
	}
		mHeaderStr += "\r\n";	
}